

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall
WeightedReservoir_MergeReservoirs_Test::TestBody(WeightedReservoir_MergeReservoirs_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  AssertionResult gtest_ar;
  float weights [8];
  atomic<int> count [8];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  float local_b4;
  float local_b0 [2];
  internal local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_98 [16];
  _Manager_type p_Stack_88;
  code *pcStack_80;
  float local_78 [8];
  undefined1 local_58 [32];
  
  lVar3 = 0;
  uVar5 = 0xb158c05f9ea9a73;
  do {
    uVar6 = (uint)(uVar5 >> 0x2d) ^ (uint)(uVar5 >> 0x1b);
    bVar4 = (byte)(uVar5 >> 0x3b);
    auVar1._8_8_ = in_XMM4_Qb;
    auVar1._0_8_ = in_XMM4_Qa;
    auVar1 = vcvtusi2ss_avx512f(auVar1,uVar6 >> bVar4 | uVar6 << 0x20 - bVar4);
    auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)),SUB6416(ZEXT464(0x3f7fffff),0)
                       );
    local_78[lVar3] = auVar1._0_4_ + 0.01;
    lVar3 = lVar3 + 1;
    uVar5 = uVar5 * 0x5851f42d4c957f2d + 0x32cd;
  } while (lVar3 != 8);
  local_58 = ZEXT1232(ZEXT812(0));
  local_98._8_8_ = local_58;
  local_98._0_8_ = local_78;
  p_Stack_88 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1054:29)>
               ::_M_manager;
  pcStack_80 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1054:29)>
               ::_M_invoke;
  pbrt::ParallelFor(0,1000000,(function<void_(long,_long)> *)local_98);
  if (p_Stack_88 != (_Manager_type)0x0) {
    (*p_Stack_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  local_b4 = 0.0;
  lVar3 = 0;
  do {
    local_b4 = local_b4 + *(float *)((long)local_78 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x20);
  lVar3 = 0;
  do {
    local_c0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)*(int *)(local_58 + lVar3 * 4) * 0.98) / 1000000.0);
    local_b0[0] = local_78[lVar3] / local_b4;
    testing::internal::CmpHelperLE<double,float>
              (local_a8,".98 * count[i] / double(nTrials)","weights[i] / sumW",(double *)&local_c0,
               local_b0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c0);
      pcVar7 = "";
      if (local_a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_a0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x43a,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
      if (local_c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_c0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c0.ptr_ + 8))();
        }
        local_c0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)*(int *)(local_58 + lVar3 * 4) * 1.02) / 1000000.0);
    local_b0[0] = local_78[lVar3] / local_b4;
    testing::internal::CmpHelperGE<double,float>
              (local_a8,"1.02 * count[i] / double(nTrials)","weights[i] / sumW",(double *)&local_c0,
               local_b0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c0);
      pcVar7 = "";
      if (local_a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_a0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x43b,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
      if (local_c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_c0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c0.ptr_ + 8))();
        }
        local_c0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return;
}

Assistant:

TEST(WeightedReservoir, MergeReservoirs) {
    RNG rng(6502);
    constexpr int n = 8;
    float weights[n];
    for (int i = 0; i < n; ++i)
        weights[i] = .01 + rng.Uniform<Float>();

    std::atomic<int> count[n] = {};
    int64_t nTrials = 1000000;
    ParallelFor(0, nTrials, [&](int64_t start, int64_t end) {
#ifdef PBRT_IS_MSVC
        // MSVC2019 doesn't seem to capture this as constexpr...
        constexpr int n = 8;
#endif
        int localCount[n] = {};

        for (int64_t i = start; i < end; ++i) {
            WeightedReservoirSampler<int> wrs0(i);
            WeightedReservoirSampler<int> wrs1(i + 1);

            for (int j = 0; j < n; ++j) {
                if (j & 1)
                    wrs0.Add(j, weights[j]);
                else
                    wrs1.Add(j, weights[j]);
            }

            wrs0.Merge(wrs1);
            ++localCount[wrs0.GetSample()];
        }

        for (int i = 0; i < n; ++i)
            count[i] += localCount[i];
    });

    Float sumW = std::accumulate(std::begin(weights), std::end(weights), Float(0));
    for (int i = 0; i < n; ++i) {
        EXPECT_LE(.98 * count[i] / double(nTrials), weights[i] / sumW);
        EXPECT_GE(1.02 * count[i] / double(nTrials), weights[i] / sumW);
    }
}